

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::
DecodeAttributeConnectivitiesOnFace
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,
          CornerIndex corner)

{
  uint uVar1;
  pointer pAVar2;
  bool bVar3;
  undefined4 in_register_00000034;
  uint uVar4;
  uint local_54;
  uint local_50;
  uint local_4c [3];
  undefined8 local_40;
  long local_38;
  
  local_4c[0] = corner.value_;
  if (corner.value_ == 0xffffffff) {
    local_4c[1] = 0xffffffff;
    local_4c[2] = -1;
  }
  else {
    local_4c[1] = corner.value_ - 2;
    if ((corner.value_ + 1) % 3 != 0) {
      local_4c[1] = corner.value_ + 1;
    }
    if (corner.value_ % 3 == 0) {
      local_4c[2] = corner.value_ + 2;
    }
    else {
      local_4c[2] = corner.value_ - 1;
    }
  }
  local_40 = CONCAT44(in_register_00000034,corner.value_);
  local_50 = corner.value_ / 3;
  for (local_38 = 0; local_38 != 3; local_38 = local_38 + 1) {
    uVar1 = local_4c[local_38];
    if (((ulong)uVar1 == 0xffffffff) ||
       (uVar4 = *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                     _M_head_impl)->opposite_corners_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         + (ulong)uVar1 * 4), uVar4 == 0xffffffff)) {
      uVar4 = 0;
      while( true ) {
        pAVar2 = (this->attribute_data_).
                 super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->attribute_data_).
                           super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x140) <=
            (ulong)uVar4) break;
        local_54 = uVar1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&pAVar2[uVar4].attribute_seam_corners,(int *)&local_54);
        uVar4 = uVar4 + 1;
      }
    }
    else if (((int)local_40 != -1) && (local_50 <= uVar4 / 3)) {
      for (uVar4 = 0;
          (ulong)uVar4 <
          (ulong)(((long)(this->attribute_data_).
                         super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x140); uVar4 = uVar4 + 1) {
        bVar3 = MeshEdgebreakerTraversalDecoder::DecodeAttributeSeam
                          (&this->traversal_decoder_,uVar4);
        if (bVar3) {
          local_54 = uVar1;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&(this->attribute_data_).
                      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar4].attribute_seam_corners,
                     (int *)&local_54);
        }
      }
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<
    TraversalDecoder>::DecodeAttributeConnectivitiesOnFace(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  const FaceIndex src_face_id = corner_table_->Face(corner);
  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      // Don't decode attribute seams on boundary edges (every boundary edge
      // is automatically an attribute seam).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
      continue;
    }
    const FaceIndex opp_face_id = corner_table_->Face(opp_corner);
    // Don't decode edges when the opposite face has been already processed.
    if (opp_face_id < src_face_id) {
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      const bool is_seam = traversal_decoder_.DecodeAttributeSeam(i);
      if (is_seam) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
    }
  }
  return true;
}